

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O1

int match_chain(ip_chain_t *ipc,packet_t *pkt)

{
  uint uVar1;
  list_head *plVar2;
  
  plVar2 = &ipc->rules;
  while (plVar2 = plVar2->next, plVar2 != &ipc->rules) {
    uVar1 = match_rule((ip_rule_t *)(plVar2 + -5),pkt);
    if (uVar1 == 3) break;
    if (uVar1 < 3) {
      return uVar1;
    }
  }
  return ipc->policy;
}

Assistant:

int match_chain(ip_chain_t *ipc, packet_t *pkt)
{
	int target = TARGET_NONE;
	ip_rule_t *ipr = NULL;

	list_for_each_entry(ipr, &ipc->rules, list) {
		target = match_rule(ipr, pkt);

		if (target == TARGET_RETURN) {
			return ipc->policy;
		}

		if (target == TARGET_DROP ||
			target == TARGET_ACCEPT ||
			target == TARGET_QUEUE) {
			return target;
		}
	}

	return ipc->policy;
}